

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O0

bool QtPrivate::QTypeNormalizer::skipToken(char **x,char *e,char *token,bool msvcKw)

{
  bool bVar1;
  undefined1 in_CL;
  char *in_RDX;
  char *in_RSI;
  long *in_RDI;
  undefined6 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffde;
  bool local_1;
  
  bVar1 = starts_with_token(in_RSI,in_RDX,
                            (char *)(CONCAT17(in_CL,CONCAT16(in_stack_ffffffffffffffde,
                                                             in_stack_ffffffffffffffd8)) &
                                    0x1ffffffffffffff),false);
  if (bVar1) {
    while (*in_RDX != '\0') {
      *in_RDI = *in_RDI + 1;
      in_RDX = in_RDX + 1;
    }
    while( true ) {
      bVar1 = false;
      if ((char *)*in_RDI != in_RSI) {
        bVar1 = is_space(*(char *)*in_RDI);
      }
      if (bVar1 == false) break;
      *in_RDI = *in_RDI + 1;
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static constexpr bool skipToken(const char *&x, const char *e, const char *token,
                                    bool msvcKw = false)
    {
        if (!starts_with_token(x, e, token, msvcKw))
            return false;
        while (*token++)
            x++;
        while (x != e && is_space(*x))
            x++;
        return true;
    }